

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void duckdb_je_tcache_bin_flush_small
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,uint rem)

{
  witness_t **ppwVar1;
  emap_batch_lookup_result_t *peVar2;
  uint64_t *puVar3;
  void **ppvVar4;
  ulong *puVar5;
  ticker_geom_t *ptVar6;
  char cVar7;
  uint uVar8;
  undefined8 uVar9;
  void *pvVar10;
  uint64_t uVar11;
  arena_t *paVar12;
  edata_t *peVar13;
  szind_t sVar14;
  cache_bin_t *pcVar15;
  tsd_t *ptVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  size_t sVar20;
  edata_t *peVar21;
  ulong uVar22;
  bin_t *mutex;
  uint uVar23;
  undefined8 *puVar24;
  edata_t *peVar25;
  long lVar26;
  mutex_prof_data_t *data_1;
  void **ppvVar27;
  uint uVar28;
  uint uVar29;
  pthread_mutex_t *ppVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  pthread_mutex_t *__mutex;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  bin_remote_free_data_t *pbVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  undefined8 uStack_210;
  edata_t *local_208;
  bin_remote_free_data_t remote_free_data [16];
  cache_bin_ptr_array_t local_e0;
  uint32_t *local_d0;
  ulong local_c8;
  uint local_c0;
  int local_bc;
  arena_t *local_b8;
  ulong local_b0;
  cache_bin_t *local_a8;
  long local_a0;
  size_t local_98;
  ulong local_90;
  ulong local_88;
  emap_batch_lookup_result_t *local_80;
  void **local_78;
  arena_t *local_70;
  ulong local_68;
  szind_t local_5c;
  tsd_t *local_58;
  edata_t *local_50;
  uint local_44;
  size_t local_40;
  pthread_mutex_t *local_38;
  
  ppVar30 = (pthread_mutex_t *)&DAT_00000001;
  duckdb_je_tcache_bin_flush_stashed(tsd,tcache,cache_bin,binind,true);
  ppvVar27 = cache_bin->stack_head;
  uVar29 = *(int *)&cache_bin->low_bits_empty - (int)ppvVar27 & 0xffff;
  uVar28 = uVar29 >> 3;
  if (uVar28 < (rem & 0xffff)) {
    rem = uVar28;
  }
  uVar28 = uVar28 - rem & 0xffff;
  local_c8 = (ulong)uVar28;
  local_b0 = (ulong)binind;
  local_d0 = &duckdb_je_bin_infos[local_b0].nregs;
  uVar22 = 0;
  local_a8 = cache_bin;
  local_5c = binind;
  local_58 = tsd;
  do {
    iVar32 = (int)uVar22;
    uVar34 = (int)local_c8 - iVar32;
    if (0xff < uVar34) {
      uVar34 = 0x100;
    }
    local_e0.n = (cache_bin_sz_t)uVar34;
    local_e0.ptr = (void **)((long)ppvVar27 + uVar22 * 8 + ((ulong)uVar29 - (ulong)(uVar28 * 8)));
    local_b8 = tcache->tcache_slow->arena;
    local_c0 = (uint)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard
                     [local_b0];
    uVar22 = (ulong)(uVar34 * 8 + 0x17 & 0x1ff0);
    lVar19 = -uVar22;
    sVar20 = (long)remote_free_data + lVar19 + -8;
    local_40 = sVar20;
    *(undefined8 *)((long)&uStack_210 + lVar19) = 0x11a3433;
    tcache_bin_flush_edatas_lookup
              (tsd,&local_e0,uVar34,sVar20,(emap_batch_lookup_result_t *)ppVar30);
    lVar19 = sVar20 - uVar22;
    local_68 = (ulong)uVar34;
    local_a0 = lVar19;
    if ((int)local_c8 == iVar32) {
      local_50 = (edata_t *)0x0;
      uVar22 = 0;
      local_90 = 0;
    }
    else {
      local_bc = uVar34 - 1;
      local_90 = 0;
      uVar34 = 0;
      local_44 = 0;
      peVar21 = (edata_t *)0x0;
      do {
        sVar14 = duckdb_je_bin_info_nbatched_sizes;
        uVar22 = (ulong)uVar34;
        puVar24 = *(undefined8 **)(local_40 + uVar22 * 8);
        uVar23 = (uint)*puVar24;
        local_70 = (arena_t *)duckdb_je_arenas[uVar23 & 0xfff].repr;
        if ((arena_t *)duckdb_je_arenas[uVar23 & 0xfff].repr == (arena_t *)0x0) {
          local_70 = (arena_t *)0x0;
        }
        uVar17 = (uint)((ulong)*puVar24 >> 0x26) & 0x3f;
        local_98 = CONCAT44(local_98._4_4_,duckdb_je_bin_info_nbatched_sizes);
        uVar33 = (ulong)(uVar17 << 8);
        if (local_5c < duckdb_je_bin_info_nbatched_sizes) {
          uVar33 = (ulong)uVar17 * 0x288;
        }
        uVar8 = duckdb_je_arena_bin_offsets[local_b0];
        uVar35 = uVar34 + 1;
        uVar36 = (ulong)uVar35;
        if (uVar35 < (uint)local_68) {
          lVar26 = local_40 + (ulong)uVar35 * 8;
          ppvVar4 = local_e0.ptr + uVar35;
          lVar31 = 0;
          do {
            uVar9 = **(undefined8 **)(lVar26 + lVar31 * 8);
            if ((((uVar23 ^ (uint)uVar9) & 0xfff) == 0) &&
               (((uint)((ulong)uVar9 >> 0x26) & 0x3f) == uVar17)) {
              uVar9 = *(undefined8 *)(local_40 + uVar36 * 8);
              *(undefined8 *)(local_40 + uVar36 * 8) = *(undefined8 *)(lVar26 + lVar31 * 8);
              *(undefined8 *)(lVar26 + lVar31 * 8) = uVar9;
              pvVar10 = local_e0.ptr[uVar36];
              local_e0.ptr[uVar36] = ppvVar4[lVar31];
              ppvVar4[lVar31] = pvVar10;
              uVar36 = (ulong)((int)uVar36 + 1);
            }
            uVar35 = (uint)uVar36;
            lVar31 = lVar31 + 1;
            local_78 = ppvVar4;
          } while (local_bc - uVar34 != (int)lVar31);
        }
        ppVar30 = (pthread_mutex_t *)((long)&local_70->nthreads[0].repr + uVar33 + uVar8);
        bVar42 = local_5c < sVar14;
        bVar39 = local_70 != local_b8;
        local_78 = (void **)CONCAT44(local_78._4_4_,uVar35);
        local_88 = (ulong)(uVar35 - uVar34);
        bVar38 = local_88 <= duckdb_je_opt_bin_info_remote_free_max_batch;
        bVar40 = uVar17 != local_c0;
        local_50 = peVar21;
        if (((bVar40 || bVar39) && bVar42) && bVar38) {
          local_38 = (pthread_mutex_t *)(ulong)uVar8;
          *(undefined8 *)(lVar19 + -8) = 0x11a3616;
          iVar18 = pthread_mutex_trylock((pthread_mutex_t *)((long)ppVar30 + 0x48));
          bVar41 = iVar18 == 0;
          if ((bVar41) &&
             (((emap_batch_lookup_result_t *)((long)ppVar30 + 0x38))->edata =
                   (edata_t *)
                   ((long)&((emap_batch_lookup_result_t *)((long)ppVar30 + 0x38))->edata->e_bits + 1
                   ), (tsd_t *)((emap_batch_lookup_result_t *)((long)ppVar30 + 0x30))->edata != tsd)
             ) {
            ((emap_batch_lookup_result_t *)((long)ppVar30 + 0x30))->edata = (edata_t *)tsd;
            ppVar30[1].__align = (long)((long)&((edata_t *)ppVar30[1].__align)->e_bits + 1);
          }
        }
        else {
          bVar41 = false;
        }
        uVar33 = local_88;
        local_38 = ppVar30;
        if ((((bVar40 || bVar39) && bVar42) && bVar38) && !bVar41) {
          local_80 = (emap_batch_lookup_result_t *)((long)ppVar30 + 0x100);
          *(undefined8 *)(lVar19 + -8) = 0x11a366c;
          sVar20 = duckdb_je_batcher_push_begin
                             ((tsdn_t *)tsd,(batcher_t *)((long)ppVar30 + 0x100),uVar33);
          ptVar16 = local_58;
          peVar2 = local_80;
          bVar42 = sVar20 != 0xffffffffffffffff;
          if (bVar42) {
            if ((uint)local_78 != uVar34) {
              puVar24 = (undefined8 *)((long)local_38 + sVar20 * 0x10 + 400);
              uVar33 = local_88;
              uVar23 = uVar34;
              do {
                puVar24[-1] = local_e0.ptr[uVar23];
                *puVar24 = *(undefined8 *)(local_40 + (ulong)uVar23 * 8);
                uVar23 = uVar23 + 1;
                puVar24 = puVar24 + 2;
                uVar33 = uVar33 - 1;
              } while (uVar33 != 0);
            }
            *(undefined8 *)(lVar19 + -8) = 0x11a36cf;
            batcher_push_end((tsdn_t *)ptVar16,(batcher_t *)peVar2);
          }
          bVar38 = sVar20 == 0xffffffffffffffff;
        }
        else {
          bVar38 = false;
          bVar42 = false;
        }
        ppvVar4 = local_78;
        pcVar15 = local_a8;
        uVar23 = (uint)local_78;
        if (bVar42) {
          uVar23 = (uint)local_68;
          ppVar30 = local_38;
          tsd = local_58;
          peVar21 = local_50;
          uVar34 = (uint)local_78;
        }
        else {
          if (!bVar41) {
            ppVar30 = (pthread_mutex_t *)((long)local_38 + 0x48);
            *(undefined8 *)(lVar19 + -8) = 0x11a3713;
            iVar18 = pthread_mutex_trylock(ppVar30);
            ppVar30 = local_38;
            if (iVar18 != 0) {
              *(undefined8 *)(lVar19 + -8) = 0x11a3723;
              duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&ppVar30->__data);
              *(undefined1 *)((long)local_38 + 0x40) = 1;
            }
            ((emap_batch_lookup_result_t *)((long)local_38 + 0x38))->edata =
                 (edata_t *)
                 ((long)&((emap_batch_lookup_result_t *)((long)local_38 + 0x38))->edata->e_bits + 1)
            ;
            if ((tsd_t *)((emap_batch_lookup_result_t *)((long)local_38 + 0x30))->edata != local_58)
            {
              ((emap_batch_lookup_result_t *)((long)local_38 + 0x30))->edata = (edata_t *)local_58;
              local_38[1].__align = (long)((long)&((edata_t *)local_38[1].__align)->e_bits + 1);
            }
          }
          if (bVar38) {
            local_38[5].__align = (long)((long)&((edata_t *)local_38[5].__align)->e_bits + 1);
          }
          if ((local_70 == local_b8) && ((local_90 & 1) == 0)) {
            ((emap_batch_lookup_result_t *)((long)local_38 + 0x98))->edata =
                 (edata_t *)
                 ((long)&((emap_batch_lookup_result_t *)((long)local_38 + 0x98))->edata->e_bits + 1)
            ;
            uVar11 = (pcVar15->tstats).nrequests;
            ((emap_batch_lookup_result_t *)((long)local_38 + 0x80))->edata =
                 (edata_t *)
                 ((long)&((emap_batch_lookup_result_t *)((long)local_38 + 0x80))->edata->e_bits +
                 uVar11);
            (pcVar15->tstats).nrequests = 0;
            local_90 = CONCAT71((int7)(uVar11 >> 8),1);
          }
          uVar17 = duckdb_je_arena_binind_div_info[local_b0].magic;
          ppVar30 = local_38;
          if (uVar34 < uVar23) {
            local_80 = (emap_batch_lookup_result_t *)(ulong)(~uVar34 + uVar23);
            sVar20 = local_40;
            do {
              ptVar16 = local_58;
              paVar12 = local_70;
              peVar21 = *(edata_t **)(sVar20 + uVar22 * 8);
              uVar33 = ((long)local_e0.ptr[uVar22] - (long)peVar21->e_addr) * (ulong)uVar17;
              puVar5 = (ulong *)((long)&peVar21->field_6 + (uVar33 >> 0x26) * 8);
              *puVar5 = *puVar5 ^ 1L << ((byte)(uVar33 >> 0x20) & 0x3f);
              uVar33 = peVar21->e_bits + 0x10000000;
              peVar21->e_bits = uVar33;
              uVar34 = (uint)(uVar33 >> 0x1c) & 0x3ff;
              if (uVar34 == *local_d0) {
                *(undefined8 *)(lVar19 + -8) = 0x11a3821;
                duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                          ((tsdn_t *)ptVar16,paVar12,peVar21,(bin_t *)&ppVar30->__data);
                ppVar30 = local_38;
                sVar20 = local_40;
                if (local_44 < (uint)local_68) {
                  *(edata_t **)(local_a0 + (ulong)local_44 * 8) = peVar21;
                  local_44 = local_44 + 1;
                }
                else {
                  (peVar21->field_5).ql_link_active.qre_next = peVar21;
                  (peVar21->field_5).ql_link_active.qre_prev = peVar21;
                  if (local_50 != (edata_t *)0x0) {
                    (peVar21->field_5).ql_link_active.qre_next =
                         (local_50->field_5).ql_link_active.qre_prev;
                    (local_50->field_5).ql_link_active.qre_prev = peVar21;
                    (peVar21->field_5).ql_link_active.qre_prev =
                         (((peVar21->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                         qre_next;
                    (((local_50->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next
                         = local_50;
                    (((peVar21->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next
                         = peVar21;
                  }
                  local_50 = (peVar21->field_5).ql_link_active.qre_next;
                }
              }
              else if ((uVar34 == 1) &&
                      (((emap_batch_lookup_result_t *)((long)ppVar30 + 0xe0))->edata != peVar21)) {
                *(undefined8 *)(lVar19 + -8) = 0x11a385e;
                duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                          ((tsdn_t *)ptVar16,paVar12,peVar21,(bin_t *)&ppVar30->__data);
                ppVar30 = local_38;
                sVar20 = local_40;
              }
              uVar22 = uVar22 + 1;
            } while (((ulong)ppvVar4 & 0xffffffff) != uVar22);
            local_80 = (emap_batch_lookup_result_t *)((long)local_80 + 1);
            uVar34 = (uint)local_78;
          }
          else {
            local_80 = (emap_batch_lookup_result_t *)0x0;
            uVar34 = uVar23;
          }
          tsd = local_58;
          if (local_5c < (uint)local_98) {
            peVar2 = (emap_batch_lookup_result_t *)((long)ppVar30 + 0x100);
            *(undefined8 *)(lVar19 + -8) = 0x11a38fb;
            peVar21 = (edata_t *)duckdb_je_batcher_pop_begin((tsdn_t *)tsd,(batcher_t *)peVar2);
            if (peVar21 != (edata_t *)0xffffffffffffffff) {
              *(undefined8 *)(lVar19 + -8) = 0x11a3913;
              local_98 = duckdb_je_batcher_pop_get_pushes((tsdn_t *)tsd,(batcher_t *)peVar2);
              ppVar30 = local_38;
              if (peVar21 != (edata_t *)0x0) {
                lVar26 = 0;
                peVar25 = peVar21;
                do {
                  puVar24 = (undefined8 *)((long)ppVar30 + lVar26 + 0x188);
                  uVar9 = puVar24[1];
                  *(undefined8 *)((long)remote_free_data + lVar26 + -8) = *puVar24;
                  *(undefined8 *)((long)&remote_free_data[0].ptr + lVar26) = uVar9;
                  lVar26 = lVar26 + 0x10;
                  peVar25 = (edata_t *)((long)&peVar25[-1].field_6 + 0x3f);
                } while (peVar25 != (edata_t *)0x0);
              }
              *(undefined8 *)(lVar19 + -8) = 0x11a394e;
              batcher_pop_end((tsdn_t *)tsd,(batcher_t *)peVar2);
              ppVar30 = local_38;
              if (peVar21 != (edata_t *)0x0) {
                remote_free_data[0xf].slab = peVar21;
                pbVar37 = remote_free_data;
                uVar23 = local_44;
                do {
                  ptVar16 = local_58;
                  paVar12 = local_70;
                  peVar25 = (edata_t *)pbVar37->ptr;
                  uVar22 = ((long)pbVar37[-1].slab - (long)peVar25->e_addr) * (ulong)uVar17;
                  puVar5 = (ulong *)((long)&peVar25->field_6 + (uVar22 >> 0x26) * 8);
                  *puVar5 = *puVar5 ^ 1L << ((byte)(uVar22 >> 0x20) & 0x3f);
                  uVar22 = peVar25->e_bits + 0x10000000;
                  peVar25->e_bits = uVar22;
                  uVar34 = (uint)(uVar22 >> 0x1c) & 0x3ff;
                  if (uVar34 == *local_d0) {
                    *(undefined8 *)(lVar19 + -8) = 0x11a39d1;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                              ((tsdn_t *)ptVar16,paVar12,peVar25,(bin_t *)&ppVar30->__data);
                    ppVar30 = local_38;
                    if (uVar23 < (uint)local_68) {
                      *(edata_t **)(local_a0 + (ulong)uVar23 * 8) = peVar25;
                      uVar23 = uVar23 + 1;
                    }
                    else {
                      (peVar25->field_5).ql_link_active.qre_next = peVar25;
                      (peVar25->field_5).ql_link_active.qre_prev = peVar25;
                      if (local_50 != (edata_t *)0x0) {
                        (peVar25->field_5).ql_link_active.qre_next =
                             (local_50->field_5).ql_link_active.qre_prev;
                        (local_50->field_5).ql_link_active.qre_prev = peVar25;
                        (peVar25->field_5).ql_link_active.qre_prev =
                             (((peVar25->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                             qre_next;
                        (((local_50->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                        qre_next = local_50;
                        (((peVar25->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                        qre_next = peVar25;
                      }
                      local_50 = (peVar25->field_5).ql_link_active.qre_next;
                    }
                  }
                  else if ((uVar34 == 1) &&
                          (((emap_batch_lookup_result_t *)((long)ppVar30 + 0xe0))->edata != peVar25)
                          ) {
                    *(undefined8 *)(lVar19 + -8) = 0x11a3a08;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                              ((tsdn_t *)ptVar16,paVar12,peVar25,(bin_t *)&ppVar30->__data);
                    ppVar30 = local_38;
                  }
                  pbVar37 = pbVar37 + 1;
                  peVar21 = (edata_t *)((long)&peVar21[-1].field_6 + 0x3f);
                } while (peVar21 != (edata_t *)0x0);
                local_80 = (emap_batch_lookup_result_t *)
                           ((long)local_80 + (long)remote_free_data[0xf].slab);
                tsd = local_58;
                peVar21 = remote_free_data[0xf].slab;
                uVar34 = (uint)local_78;
                local_44 = uVar23;
              }
              ((emap_batch_lookup_result_t *)((long)ppVar30 + 0xc0))->edata =
                   (edata_t *)
                   ((long)&((emap_batch_lookup_result_t *)((long)ppVar30 + 0xc0))->edata->e_bits + 1
                   );
              ((emap_batch_lookup_result_t *)((long)ppVar30 + 0xd0))->edata =
                   (edata_t *)
                   ((long)&((emap_batch_lookup_result_t *)((long)ppVar30 + 0xd0))->edata->e_bits +
                   local_98);
              ((emap_batch_lookup_result_t *)((long)ppVar30 + 0xd8))->edata =
                   (edata_t *)
                   ((long)&peVar21->e_bits +
                   (long)&((emap_batch_lookup_result_t *)((long)ppVar30 + 0xd8))->edata->e_bits);
              goto LAB_011a3aac;
            }
            uVar23 = (uint)local_68;
            ppVar30 = local_38;
          }
          else {
LAB_011a3aac:
            uVar23 = (uint)local_68;
          }
          peVar21 = local_50;
          ppVar30[3].__align =
               (long)((long)&((edata_t *)ppVar30[3].__align)->e_bits + (long)local_80);
          ((emap_batch_lookup_result_t *)((long)ppVar30 + 0x88))->edata =
               (edata_t *)
               ((long)((emap_batch_lookup_result_t *)((long)ppVar30 + 0x88))->edata - (long)local_80
               );
          *(undefined1 *)((long)ppVar30 + 0x40) = 0;
          ppVar30 = (pthread_mutex_t *)((long)ppVar30 + 0x48);
          *(undefined8 *)(lVar19 + -8) = 0x11a3ad4;
          pthread_mutex_unlock(ppVar30);
        }
        paVar12 = local_70;
        if (tsd != (tsd_t *)0x0) {
          cVar7 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
          ptVar6 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
          ptVar6->tick = ptVar6->tick - (int)local_88;
          if (ptVar6->tick < 0) {
            if (cVar7 < '\x01') {
              uVar22 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                       0x5851f42d4c957f2d + 0x14057b7ef767814f;
              tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar22;
              (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).tick =
                   (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar22 >> 0x3a] *
                             (long)(tsd->
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                   ).nticks) / 0x3d);
              *(undefined8 *)(lVar19 + -8) = 0x11a3b98;
              duckdb_je_arena_decay((tsdn_t *)tsd,paVar12,false,false);
            }
            else {
              (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).tick =
                   0;
            }
          }
        }
      } while (uVar34 < uVar23);
      local_50 = peVar21;
      uVar22 = (ulong)local_44;
    }
    paVar12 = local_b8;
    sVar14 = local_5c;
    peVar21 = local_50;
    if ((int)uVar22 != 0) {
      uVar33 = 0;
      do {
        peVar21 = *(edata_t **)(local_a0 + uVar33 * 8);
        paVar12 = (arena_t *)duckdb_je_arenas[(uint)peVar21->e_bits & 0xfff].repr;
        *(undefined8 *)(lVar19 + -8) = 0x11a3bd4;
        duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar12,peVar21);
        uVar33 = uVar33 + 1;
        paVar12 = local_b8;
        sVar14 = local_5c;
        peVar21 = local_50;
      } while (uVar22 != uVar33);
    }
    while (local_b8 = paVar12, local_5c = sVar14, peVar21 != (edata_t *)0x0) {
      peVar25 = (peVar21->field_5).ql_link_active.qre_next;
      if (peVar25 == peVar21) {
        peVar25 = (edata_t *)0x0;
      }
      else {
        (((peVar21->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
             (((peVar21->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev;
        (((peVar21->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev =
             (peVar21->field_5).ql_link_active.qre_prev;
        peVar13 = (peVar21->field_5).ql_link_active.qre_next;
        (peVar21->field_5).ql_link_active.qre_prev =
             (((peVar21->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
        (((peVar13->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar13;
        (((peVar21->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar21;
      }
      paVar12 = (arena_t *)duckdb_je_arenas[(uint)peVar21->e_bits & 0xfff].repr;
      *(undefined8 *)(lVar19 + -8) = 0x11a3c46;
      duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar12,peVar21);
      paVar12 = local_b8;
      sVar14 = local_5c;
      peVar21 = peVar25;
    }
    if ((local_90 & 1) == 0) {
      *(undefined8 *)(lVar19 + -8) = 0x11a3c6b;
      mutex = duckdb_je_arena_bin_choose((tsdn_t *)tsd,paVar12,sVar14,(uint *)0x0);
      __mutex = (pthread_mutex_t *)((long)&(mutex->lock).field_0 + 0x48);
      *(undefined8 *)(lVar19 + -8) = 0x11a3c7d;
      iVar18 = pthread_mutex_trylock(__mutex);
      if (iVar18 != 0) {
        *(undefined8 *)(lVar19 + -8) = 0x11a3c89;
        duckdb_je_malloc_mutex_lock_slow(&mutex->lock);
        (mutex->lock).field_0.field_0.locked.repr = true;
      }
      puVar3 = &(mutex->lock).field_0.field_0.prof_data.n_lock_ops;
      *puVar3 = *puVar3 + 1;
      if (&((mutex->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        *(tsd_t **)((long)&(mutex->lock).field_0 + 0x30) = tsd;
        ppwVar1 = &(mutex->lock).field_0.witness.link.qre_prev;
        *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
      }
      puVar3 = &(mutex->stats).nflushes;
      *puVar3 = *puVar3 + 1;
      puVar3 = &(mutex->stats).nrequests;
      *puVar3 = *puVar3 + (local_a8->tstats).nrequests;
      (local_a8->tstats).nrequests = 0;
      (mutex->lock).field_0.field_0.locked.repr = false;
      *(undefined8 *)(lVar19 + -8) = 0x11a3ccc;
      pthread_mutex_unlock(__mutex);
    }
    pcVar15 = local_a8;
    uVar23 = (int)local_68 + iVar32;
    uVar22 = (ulong)uVar23;
    uVar34 = (uint)local_c8;
    if (uVar34 <= uVar23) {
      ppvVar27 = local_a8->stack_head;
      memmove((void *)((long)ppvVar27 + (ulong)(uVar34 * 8)),ppvVar27,
              (ulong)(((*(int *)&local_a8->low_bits_empty - (int)ppvVar27 & 0xffffU) >> 3) - uVar34)
              << 3);
      ppvVar27 = (void **)((ulong)(uVar34 * 8) + (long)pcVar15->stack_head);
      pcVar15->stack_head = ppvVar27;
      if ((ushort)((*(int *)&pcVar15->low_bits_empty - (int)ppvVar27 & 0xffffU) >> 3) <
          (ushort)((short)*(int *)&pcVar15->low_bits_empty - pcVar15->low_bits_low_water) >> 3) {
        pcVar15->low_bits_low_water = (uint16_t)ppvVar27;
      }
      return;
    }
  } while( true );
}

Assistant:

void
tcache_bin_flush_small(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, unsigned rem) {
	tcache_bin_flush_bottom(tsd, tcache, cache_bin, binind, rem,
	    /* small */ true);
}